

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O0

void __thiscall Control::loop(Control *this,GameData *Data,undefined4 param_3)

{
  bool bVar1;
  int ope;
  int local_b0;
  int Tempop;
  GameData local_a0;
  byte local_22;
  byte local_21;
  bool flagGameOver;
  GameData *pGStack_20;
  bool flagQuit;
  GameData *Data_local;
  Control *this_local;
  GameOperator Operator_local;
  Draw DrawUi_local;
  
  local_21 = 0;
  local_22 = 0;
  pGStack_20 = Data;
  Data_local = (GameData *)this;
  this_local._0_4_ = param_3;
  GameData::InitNewGame(Data);
  do {
    GameData::GameData(&local_a0,Data);
    Draw::PrintUi((Draw *)((long)&this_local + 7),&local_a0,(bool)(local_21 & 1),
                  (bool)(local_22 & 1));
    GameData::~GameData(&local_a0);
    if ((local_22 & 1) == 0) {
      if ((local_21 & 1) == 0) {
        ope = GameOperator::GetMoveNumber((GameOperator *)&this_local);
        if (ope == 5) {
          local_21 = 1;
        }
        if (((ope != 7) && (ope != 6)) && (ope != 5)) {
          GameOperator::Move((GameOperator *)&this_local,Data,ope);
          bVar1 = GameData::IsGameOver(Data);
          if (bVar1) {
            local_22 = 1;
          }
          if ((Data->IsMove & 1U) != 0) {
            GameData::MakeNewNumber(Data);
          }
        }
      }
      else {
        local_b0 = GameOperator::GetMoveNumber((GameOperator *)&this_local);
        while (local_b0 != 6 && local_b0 != 7) {
          local_b0 = GameOperator::GetMoveNumber((GameOperator *)&this_local);
        }
        if (local_b0 == 6) {
          return;
        }
        local_21 = 0;
      }
    }
    else {
      local_b0 = GameOperator::GetMoveNumber((GameOperator *)&this_local);
      while (local_b0 != 6 && local_b0 != 7) {
        local_b0 = GameOperator::GetMoveNumber((GameOperator *)&this_local);
      }
      if (local_b0 != 6) {
        return;
      }
      GameData::InitNewGame(Data);
      local_22 = 0;
    }
    Draw::ClearScreen((Draw *)((long)&this_local + 7));
  } while( true );
}

Assistant:

void Control::loop(GameData Data, Draw DrawUi, GameOperator Operator) {
    bool flagQuit = false;
    bool flagGameOver = false;
    Data.InitNewGame();
    while (true) {
        DrawUi.PrintUi(Data, flagQuit, flagGameOver);

        int Tempop;
        if (flagGameOver) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES) {
                Data.InitNewGame();
                flagGameOver = false;
            } else
                break;
        }

        else if (flagQuit) {
            Tempop = Operator.GetMoveNumber();
            while (Tempop != YES && Tempop != NO)
                Tempop = Operator.GetMoveNumber();
            if (Tempop == YES)
                break;
            else
                flagQuit = false;
        }

        else
        {
            Tempop = Operator.GetMoveNumber();

            if (Tempop == QUIT)
                flagQuit = true;

            if (Tempop != NO && Tempop != YES && Tempop != QUIT) {
                Operator.Move(Data, Tempop);
                if (Data.IsGameOver())
                    flagGameOver = true;
                if(Data.IsMove)
                    Data.MakeNewNumber();
            }
        }

        DrawUi.ClearScreen();
    }
}